

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_buffer.cpp
# Opt level: O3

void __thiscall
duckdb::FixedSizeBuffer::Serialize
          (FixedSizeBuffer *this,PartialBlockManager *partial_block_manager,idx_t available_segments
          ,idx_t segment_size,idx_t bitmask_offset)

{
  BlockManager *block_manager;
  BufferManager *pBVar1;
  data_ptr_t pdVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  PartialBlockState state;
  PartialBlock *pPVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  pointer pPVar8;
  InternalException *this_01;
  _Head_base<0UL,_duckdb::MetadataManager_*,_false> this_02;
  BufferHandle dst_handle;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [32];
  _Head_base<0UL,_duckdb::MetadataManager_*,_false> local_78;
  _Head_base<0UL,_duckdb::MetadataManager_*,_false> _Stack_70;
  undefined1 local_68 [16];
  size_type local_58;
  __uniq_ptr_data<duckdb::MetadataManager,_std::default_delete<duckdb::MetadataManager>,_true,_true>
  local_48;
  __uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_> _Stack_40;
  
  bVar6 = BufferHandle::IsValid(&this->buffer_handle);
  if (bVar6) {
    if ((this->dirty != false) || ((this->block_pointer).block_id == -1)) {
      SetAllocationSize(this,available_segments,segment_size,bitmask_offset);
      if ((this->block_pointer).block_id != -1) {
        (*this->block_manager->_vptr_BlockManager[9])();
      }
      uVar7 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(this->allocation_size);
      PartialBlockManager::GetBlockAllocation
                ((PartialBlockAllocation *)local_98,partial_block_manager,uVar7);
      (this->block_pointer).block_id = local_98._16_8_;
      (this->block_pointer).offset = local_98._28_4_;
      block_manager = this->block_manager;
      if (_Stack_70._M_head_impl == (MetadataManager *)0x0) {
        this_02._M_head_impl = (MetadataManager *)operator_new(0x50);
        state.offset = local_98._28_4_;
        state.block_size = local_98._24_4_;
        state.block_id = local_98._16_8_;
        state._16_8_ = local_78._M_head_impl;
        PartialBlockForIndex::PartialBlockForIndex
                  ((PartialBlockForIndex *)this_02._M_head_impl,state,block_manager,
                   &this->block_handle);
        if ((__uniq_ptr_data<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true,_true>
             )_Stack_70._M_head_impl !=
            (tuple<duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>)0x0) {
          pPVar3 = (PartialBlock *)&(_Stack_70._M_head_impl)->block_manager;
          _Stack_70._M_head_impl = this_02._M_head_impl;
          (*pPVar3->_vptr_PartialBlock[1])();
          this_02._M_head_impl = _Stack_70._M_head_impl;
        }
      }
      else {
        pBVar1 = block_manager->buffer_manager;
        pPVar8 = unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>::
                 operator->((unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>
                             *)&_Stack_70);
        (*pBVar1->_vptr_BufferManager[7])(local_b8,pBVar1,&pPVar8->block_handle);
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid
                  ((optional_ptr<duckdb::FileBuffer,_true> *)local_a8);
        pdVar2 = *(data_ptr_t *)(local_a8._0_8_ + 0x10);
        uVar7 = (this->block_pointer).offset;
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->buffer_handle).node);
        switchD_012b9b0d::default
                  (pdVar2 + uVar7,((this->buffer_handle).node.ptr)->buffer,this->allocation_size);
        BufferHandle::~BufferHandle((BufferHandle *)local_b8);
        this_02._M_head_impl = _Stack_70._M_head_impl;
      }
      _Stack_70._M_head_impl = this_02._M_head_impl;
      BufferHandle::Destroy(&this->buffer_handle);
      local_58 = local_98._16_8_;
      local_68._0_8_ = local_98._0_8_;
      local_68._8_8_ = local_98._8_8_;
      local_48.
      super___uniq_ptr_impl<duckdb::MetadataManager,_std::default_delete<duckdb::MetadataManager>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::MetadataManager_*,_std::default_delete<duckdb::MetadataManager>_>
      .super__Head_base<0UL,_duckdb::MetadataManager_*,_false>._M_head_impl =
           (__uniq_ptr_impl<duckdb::MetadataManager,_std::default_delete<duckdb::MetadataManager>_>)
           (__uniq_ptr_impl<duckdb::MetadataManager,_std::default_delete<duckdb::MetadataManager>_>)
           local_78._M_head_impl;
      _Stack_40._M_t.
      super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>.
      super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl =
           (tuple<duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>)
           (tuple<duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>)
           _Stack_70._M_head_impl;
      _Stack_70._M_head_impl = (MetadataManager *)0x0;
      PartialBlockManager::RegisterPartialBlock
                (partial_block_manager,(PartialBlockAllocation *)local_68);
      if ((_Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>)
          _Stack_40._M_t.
          super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>
          .super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl != (PartialBlock *)0x0)
      {
        (**(code **)(*(long *)_Stack_40._M_t.
                              super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>
                              .super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl + 8
                    ))();
      }
      _Stack_40._M_t.
      super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>.
      super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl =
           (tuple<duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>)
           (_Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>)0x0
      ;
      BlockManager::RegisterBlock((BlockManager *)local_b8,(block_id_t)this->block_manager);
      uVar5 = local_b8._8_8_;
      uVar4 = local_b8._0_8_;
      local_b8._0_8_ = (element_type *)0x0;
      local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (this->block_handle).internal.
                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (this->block_handle).internal.
      super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar4;
      (this->block_handle).internal.
      super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
        }
      }
      this->dirty = false;
      if (_Stack_70._M_head_impl != (MetadataManager *)0x0) {
        (*(code *)(_Stack_70._M_head_impl)->block_manager->buffer_manager)();
      }
    }
  }
  else if (((this->block_pointer).block_id == -1) || (this->dirty == true)) {
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_98._0_8_ = local_98 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"invalid or missing buffer in FixedSizeAllocator","");
    InternalException::InternalException(this_01,(string *)local_98);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void FixedSizeBuffer::Serialize(PartialBlockManager &partial_block_manager, const idx_t available_segments,
                                const idx_t segment_size, const idx_t bitmask_offset) {

	// Early-out, if the block is already on disk and not in memory.
	if (!InMemory()) {
		if (!OnDisk() || dirty) {
			throw InternalException("invalid or missing buffer in FixedSizeAllocator");
		}
		return;
	}

	// Early-out, if the buffer is already on disk and not dirty.
	if (!dirty && OnDisk()) {
		return;
	}

	// Adjust the allocation size.
	D_ASSERT(segment_count != 0);
	SetAllocationSize(available_segments, segment_size, bitmask_offset);

	// the buffer is in memory, so we copied it onto a new buffer when pinning
	D_ASSERT(InMemory());
	if (OnDisk()) {
		block_manager.MarkBlockAsModified(block_pointer.block_id);
	}

	// now we write the changes, first get a partial block allocation
	PartialBlockAllocation allocation =
	    partial_block_manager.GetBlockAllocation(NumericCast<uint32_t>(allocation_size));
	block_pointer.block_id = allocation.state.block_id;
	block_pointer.offset = allocation.state.offset;

	auto &buffer_manager = block_manager.buffer_manager;

	if (allocation.partial_block) {
		// copy to an existing partial block
		D_ASSERT(block_pointer.offset > 0);
		auto &p_block_for_index = allocation.partial_block->Cast<PartialBlockForIndex>();
		auto dst_handle = buffer_manager.Pin(p_block_for_index.block_handle);
		memcpy(dst_handle.Ptr() + block_pointer.offset, buffer_handle.Ptr(), allocation_size);

	} else {
		// create a new block that can potentially be used as a partial block
		D_ASSERT(block_handle);
		D_ASSERT(!block_pointer.offset);
		auto p_block_for_index = make_uniq<PartialBlockForIndex>(allocation.state, block_manager, block_handle);
		allocation.partial_block = std::move(p_block_for_index);
	}

	// resetting this buffer
	buffer_handle.Destroy();

	// register the partial block
	partial_block_manager.RegisterPartialBlock(std::move(allocation));

	block_handle = block_manager.RegisterBlock(block_pointer.block_id);
	D_ASSERT(block_handle->BlockId() < MAXIMUM_BLOCK);

	// we persist any changes, so the buffer is no longer dirty
	dirty = false;
}